

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestValidate.c
# Opt level: O0

void RDL_validate(RDL_data *data,RDL_DimacsGraph *dimacs_graph,int timeout,int *urf_result,
                 int *basis_result)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  void *__ptr_00;
  void *__ptr_01;
  uint local_a4;
  uint *nof_basis_bcc;
  uint *bcc;
  uint *urf_numbers;
  char **basis_cycle_array;
  char **sortable_cycle_array;
  char **final_cycle_array;
  char **other_cycle_array;
  RDL_cycle **cycle_array;
  uint local_58;
  uint max_nof_basis_bcc;
  uint edge;
  uint nof_basis;
  uint nof_edges;
  uint idx2;
  uint running_idx;
  uint curr_bcc;
  uint nof_relevant;
  uint weight;
  uint idx;
  uint URFcount;
  int *basis_result_local;
  int *urf_result_local;
  RDL_DimacsGraph *pRStack_18;
  int timeout_local;
  RDL_DimacsGraph *dimacs_graph_local;
  RDL_data *data_local;
  
  cycle_array._4_4_ = 0;
  *urf_result = 0;
  *basis_result = 0;
  _idx = basis_result;
  basis_result_local = urf_result;
  urf_result_local._4_4_ = timeout;
  pRStack_18 = dimacs_graph;
  dimacs_graph_local = (RDL_DimacsGraph *)data;
  running_idx = RDL_getRCycles(data,&other_cycle_array);
  RDL_deleteCycles(other_cycle_array,running_idx);
  sortable_cycle_array = (char **)malloc((ulong)running_idx << 3);
  __ptr = malloc((ulong)running_idx << 2);
  weight = RDL_getNofURF(dimacs_graph_local);
  edge = RDL_getNofEdges(dimacs_graph_local);
  nof_edges = 0;
  for (nof_relevant = 0; nof_relevant < weight; nof_relevant = nof_relevant + 1) {
    curr_bcc = RDL_getRCyclesForURF(dimacs_graph_local,nof_relevant,&other_cycle_array);
    curr_bcc = RDL_translateCycArray
                         (dimacs_graph_local,other_cycle_array,curr_bcc,&final_cycle_array);
    RDL_deleteCycles(other_cycle_array,curr_bcc);
    for (nof_basis = 0; nof_basis < curr_bcc; nof_basis = nof_basis + 1) {
      sortable_cycle_array[nof_edges] = final_cycle_array[nof_basis];
      *(uint *)((long)__ptr + (ulong)nof_edges * 4) = nof_relevant;
      nof_edges = nof_edges + 1;
    }
    free(final_cycle_array);
  }
  basis_cycle_array = (char **)malloc((ulong)running_idx << 3);
  for (nof_relevant = 0; nof_relevant < running_idx; nof_relevant = nof_relevant + 1) {
    pcVar2 = (char *)malloc((ulong)(edge + 1));
    basis_cycle_array[nof_relevant] = pcVar2;
    memcpy(basis_cycle_array[nof_relevant],sortable_cycle_array[nof_relevant],(ulong)edge);
    basis_cycle_array[nof_relevant][edge] = '\x02';
  }
  qsort(basis_cycle_array,(ulong)running_idx,8,RDL_cmp_cycles);
  if (pRStack_18->nof_cycles == 0xffffffff) {
    fprintf(_stderr,"skipping RC test, no RCs in input file...\n");
  }
  else if (running_idx == pRStack_18->nof_cycles) {
    for (nof_relevant = 0; nof_relevant < running_idx; nof_relevant = nof_relevant + 1) {
      iVar1 = memcmp(basis_cycle_array[nof_relevant],pRStack_18->sorted_cycles[nof_relevant],
                     (ulong)edge);
      if (iVar1 != 0) {
        fprintf(_stderr,"relevant cycle mismatch found!\n");
        *basis_result_local = 1;
        break;
      }
    }
  }
  else {
    fprintf(_stderr,"different number of relevant cycles %u vs %u!\n",(ulong)running_idx,
            (ulong)pRStack_18->nof_cycles);
    *basis_result_local = 1;
  }
  if (*basis_result_local == 0) {
    RDL_timeout_stop_fun((long)&urf_result_local + 4);
    iVar1 = RDL_validateRingFamilies
                      (sortable_cycle_array,__ptr,running_idx,edge,RDL_timeout_stop_fun);
    *basis_result_local = iVar1;
  }
  max_nof_basis_bcc = RDL_getSSSR(dimacs_graph_local,&other_cycle_array);
  __ptr_00 = malloc((ulong)max_nof_basis_bcc << 2);
  __ptr_01 = malloc((ulong)*(uint *)dimacs_graph_local->sorted_cycles << 2);
  for (nof_relevant = 0; nof_relevant < *(uint *)dimacs_graph_local->sorted_cycles;
      nof_relevant = nof_relevant + 1) {
    *(undefined4 *)((long)__ptr_01 + (ulong)nof_relevant * 4) = 0;
  }
  for (nof_relevant = 0; nof_relevant < max_nof_basis_bcc; nof_relevant = nof_relevant + 1) {
    local_58 = RDL_getEdgeId(dimacs_graph_local,**(undefined4 **)other_cycle_array[nof_relevant],
                             *(undefined4 *)(*(long *)other_cycle_array[nof_relevant] + 4));
    idx2 = **(uint **)(dimacs_graph_local->sorted_cycles[2] + (ulong)local_58 * 8);
    *(uint *)((long)__ptr_00 + (ulong)nof_relevant * 4) = idx2;
    *(int *)((long)__ptr_01 + (ulong)idx2 * 4) = *(int *)((long)__ptr_01 + (ulong)idx2 * 4) + 1;
    if (cycle_array._4_4_ < *(uint *)((long)__ptr_01 + (ulong)idx2 * 4)) {
      local_a4 = *(uint *)((long)__ptr_01 + (ulong)idx2 * 4);
    }
    else {
      local_a4 = cycle_array._4_4_;
    }
    cycle_array._4_4_ = local_a4;
  }
  RDL_translateCycArray(dimacs_graph_local,other_cycle_array,max_nof_basis_bcc,&urf_numbers);
  RDL_deleteCycles(other_cycle_array,max_nof_basis_bcc);
  RDL_timeout_stop_fun((long)&urf_result_local + 4);
  iVar1 = RDL_validateBasis(sortable_cycle_array,running_idx,urf_numbers,max_nof_basis_bcc,edge,
                            __ptr_00,RDL_timeout_stop_fun);
  *_idx = iVar1;
  free(__ptr_00);
  free(__ptr);
  free(__ptr_01);
  RDL_deleteEdgeIdxArray(sortable_cycle_array,running_idx);
  RDL_deleteEdgeIdxArray(urf_numbers,max_nof_basis_bcc);
  RDL_deleteEdgeIdxArray(basis_cycle_array,running_idx);
  return;
}

Assistant:

void RDL_validate(RDL_data* data, RDL_DimacsGraph* dimacs_graph, int timeout,
                  int* urf_result, int* basis_result)
{
  unsigned URFcount, idx, weight, nof_relevant, curr_bcc,
    running_idx, idx2, nof_edges, nof_basis, edge, max_nof_basis_bcc=0;
  RDL_cycle **cycle_array;
  char **other_cycle_array, **final_cycle_array, **sortable_cycle_array, **basis_cycle_array;
  unsigned *urf_numbers, *bcc, *nof_basis_bcc;

  *urf_result = 0;
  *basis_result = 0;

  nof_relevant = RDL_getRCycles(data, &cycle_array);
  RDL_deleteCycles(cycle_array, nof_relevant);

  final_cycle_array = malloc(nof_relevant * sizeof(*final_cycle_array));
  urf_numbers = malloc(nof_relevant * sizeof(*urf_numbers));

  URFcount = RDL_getNofURF(data);

  nof_edges = RDL_getNofEdges(data);

  for (idx = 0, running_idx = 0; idx < URFcount; ++idx) {
    weight = RDL_getRCyclesForURF(data, idx,  &cycle_array);
    weight = RDL_translateCycArray(data, cycle_array, weight, &other_cycle_array);
    RDL_deleteCycles(cycle_array, weight);

    for (idx2 = 0; idx2 < weight; ++idx2, ++running_idx) {
      final_cycle_array[running_idx] = other_cycle_array[idx2];
      urf_numbers[running_idx] = idx;

    }

    free(other_cycle_array);
  }


  sortable_cycle_array = malloc(nof_relevant * sizeof(*sortable_cycle_array));
  for (idx = 0; idx < nof_relevant; ++idx) {
    sortable_cycle_array[idx] = malloc((nof_edges + 1) * sizeof(**sortable_cycle_array));
    memcpy(sortable_cycle_array[idx], final_cycle_array[idx], nof_edges * sizeof(**sortable_cycle_array));
    sortable_cycle_array[idx][nof_edges] = 2;
  }

  qsort(sortable_cycle_array, nof_relevant, sizeof(*sortable_cycle_array), RDL_cmp_cycles);

  if (dimacs_graph->nof_cycles == UINT_MAX) {
    fprintf(stderr, "skipping RC test, no RCs in input file...\n");
  }
  else if (nof_relevant != dimacs_graph->nof_cycles) {
    fprintf(stderr, "different number of relevant cycles %u vs %u!\n",
        nof_relevant, dimacs_graph->nof_cycles);
    *urf_result = 1;
  }
  else {
    for (idx = 0; idx < nof_relevant; ++idx) {
      if (memcmp(sortable_cycle_array[idx], dimacs_graph->sorted_cycles[idx],
          nof_edges * sizeof(**sortable_cycle_array))) {
        fprintf(stderr, "relevant cycle mismatch found!\n");
        *urf_result = 1;
        break;
      }
    }
  }

  if (!*urf_result) {
    RDL_timeout_stop_fun(&timeout);

    *urf_result = RDL_validateRingFamilies((const char**)final_cycle_array, urf_numbers,
        nof_relevant, nof_edges, RDL_timeout_stop_fun);
  }

  nof_basis = RDL_getSSSR(data, &cycle_array);

  bcc = malloc(nof_basis * sizeof(*bcc));
  nof_basis_bcc = malloc(data->bccGraphs->nof_bcc * sizeof(*nof_basis_bcc));
  for (idx = 0; idx < data->bccGraphs->nof_bcc; ++idx) {
    nof_basis_bcc[idx] = 0;
  }
  for (idx = 0; idx < nof_basis; ++idx) {
    edge = RDL_getEdgeId(data, cycle_array[idx]->edges[0][0],
        cycle_array[idx]->edges[0][1]);
    curr_bcc = data->bccGraphs->edge_to_bcc_mapping[edge][0];
    bcc[idx] = curr_bcc;
    ++nof_basis_bcc[curr_bcc];
    max_nof_basis_bcc = nof_basis_bcc[curr_bcc] > max_nof_basis_bcc ? nof_basis_bcc[curr_bcc] : max_nof_basis_bcc;
  }

  RDL_translateCycArray(data, cycle_array, nof_basis, &basis_cycle_array);
  RDL_deleteCycles(cycle_array, nof_basis);

  RDL_timeout_stop_fun(&timeout);
  *basis_result = RDL_validateBasis(
      (const char**)final_cycle_array, nof_relevant,
      (const char**)basis_cycle_array, nof_basis,
      nof_edges, bcc, RDL_timeout_stop_fun);
  free(bcc);
  free(urf_numbers);
  free(nof_basis_bcc);

  RDL_deleteEdgeIdxArray(final_cycle_array, nof_relevant);
  RDL_deleteEdgeIdxArray(basis_cycle_array, nof_basis);
  RDL_deleteEdgeIdxArray(sortable_cycle_array, nof_relevant);
}